

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

SP pbrt::QuadMesh::makeFrom(SP *tris)

{
  int z;
  int w;
  undefined4 x;
  undefined4 uVar1;
  undefined4 y;
  undefined4 w_00;
  element_type *peVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  shared_ptr<pbrt::QuadMesh> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SP SVar6;
  SP *in_stack_00000088;
  vec3i idx1;
  vec3i idx0;
  size_t i;
  SP out;
  value_type *in_stack_fffffffffffffef8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  *in_stack_ffffffffffffff00;
  shared_ptr<pbrt::Material> *in_stack_ffffffffffffff28;
  shared_ptr<pbrt::QuadMesh> local_90;
  vec4i local_80;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_stack_ffffffffffffff98;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_stack_ffffffffffffffa0;
  int local_50;
  int iStack_4c;
  int local_44;
  int iStack_40;
  size_type local_38;
  
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b6856);
  std::make_shared<pbrt::QuadMesh,std::shared_ptr<pbrt::Material>&>(in_stack_ffffffffffffff28);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b6879);
  std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b688c);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::operator=(in_stack_ffffffffffffff00,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
               *)in_stack_fffffffffffffef8);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b68a9);
  std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b68bf);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b68dc);
  std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b68f4);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_38 = 0;
  do {
    sVar5 = local_38;
    peVar2 = std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b692d);
    sVar3 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::size(&peVar2->index)
    ;
    if (sVar3 <= sVar5) {
      peVar2 = std::
               __shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b6bb7);
      this = (shared_ptr<pbrt::QuadMesh> *)
             std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::size
                       (&peVar2->vertex);
      peVar2 = std::
               __shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b6bd2);
      sVar5 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::size
                        (&peVar2->index);
      if (this == (shared_ptr<pbrt::QuadMesh> *)(sVar5 * 3)) {
        std::shared_ptr<pbrt::QuadMesh>::shared_ptr(this,&local_90);
        remeshVertices(in_stack_00000088);
        std::shared_ptr<pbrt::QuadMesh>::~shared_ptr((shared_ptr<pbrt::QuadMesh> *)0x1b6c22);
      }
      else {
        std::shared_ptr<pbrt::QuadMesh>::shared_ptr
                  (this,(shared_ptr<pbrt::QuadMesh> *)in_stack_fffffffffffffef8);
      }
      std::shared_ptr<pbrt::QuadMesh>::~shared_ptr((shared_ptr<pbrt::QuadMesh> *)0x1b6c73);
      SVar6.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar6.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (SP)SVar6.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>;
    }
    peVar2 = std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b6957);
    pvVar4 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[]
                       (&peVar2->index,local_38);
    x = pvVar4->x;
    y = pvVar4->y;
    z = pvVar4->z;
    peVar2 = std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b69a2);
    sVar5 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::size(&peVar2->index)
    ;
    if (local_38 + 1 < sVar5) {
      peVar2 = std::
               __shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b69cc);
      pvVar4 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[]
                         (&peVar2->index,local_38 + 1);
      uVar1 = pvVar4->x;
      w_00 = pvVar4->y;
      w = pvVar4->z;
      if ((uVar1 == x) && (w_00 == z)) {
        std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b6a31);
        math::vec4i::vec4i((vec4i *)&stack0xffffffffffffffa0,x,y,z,w);
        std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::push_back
                  ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)
                   in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_38 = local_38 + 1;
      }
      else {
        if ((uVar1 != z) || (w != x)) goto LAB_001b6b3e;
        std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b6adb);
        math::vec4i::vec4i((vec4i *)&stack0xffffffffffffff90,x,y,z,w_00);
        std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::push_back
                  ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)
                   in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_38 = local_38 + 1;
      }
    }
    else {
LAB_001b6b3e:
      std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1b6b4b);
      math::vec4i::vec4i(&local_80,x,y,z,z);
      std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::push_back
                ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

QuadMesh::SP QuadMesh::makeFrom(TriangleMesh::SP tris)
  {
    QuadMesh::SP out = std::make_shared<QuadMesh>(tris->material);
    out->textures = tris->textures;
    // out->texcoord = in->texcoord;
    out->vertex   = tris->vertex;
    out->normal   = tris->normal;
      
    for (size_t i=0;i<tris->index.size();i++) {
      vec3i idx0 = tris->index[i+0];
      if ((i+1) < tris->index.size()) {
        vec3i idx1 = tris->index[i+1];
        if (idx1.x == idx0.x && idx1.y == idx0.z) {
          // could merge!!!
          out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx1.z));
          ++i;
          continue;
        }
        if (idx1.x == idx0.z && idx1.z == idx0.x) {
          // could merge!!!
          out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx1.y));
          ++i;
          continue;
        }
      }
      // could not merge :-( - emit tri as degenerate quad
      out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx0.z));
    }
      
    if (tris->vertex.size() == 3*tris->index.size()) {
      return remeshVertices(out);
    }
    else
      return out;
  }